

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_options.hpp
# Opt level: O0

string_type * __thiscall
jsoncons::basic_json_options_common<wchar_t>::inf_to_num_abi_cxx11_
          (basic_json_options_common<wchar_t> *this)

{
  long in_RSI;
  string_type *in_RDI;
  
  if ((*(ushort *)(in_RSI + 8) >> 1 & 1) == 0) {
    std::__cxx11::wstring::wstring((wstring *)in_RDI,(wstring *)(in_RSI + 0x30));
  }
  else {
    std::__cxx11::wstring::wstring((wstring *)in_RDI,(wstring *)(in_RSI + 0x30));
  }
  return in_RDI;
}

Assistant:

string_type inf_to_num() const
    {
        if (enable_inf_to_num_)
        {
            return inf_to_num_;
        }
        else
        {
            return inf_to_num_; // empty string
        }
    }